

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_decorations.cpp
# Opt level: O0

bool spvtools::val::anon_unknown_0::hasImproperStraddle
               (uint32_t id,uint32_t offset,LayoutConstraints *inherited,
               MemberConstraints *constraints,ValidationState_t *vstate)

{
  uint32_t uVar1;
  uint32_t L;
  uint32_t F;
  uint32_t size;
  ValidationState_t *vstate_local;
  MemberConstraints *constraints_local;
  LayoutConstraints *inherited_local;
  uint32_t offset_local;
  uint32_t id_local;
  
  uVar1 = getSize(id,inherited,constraints,vstate);
  if (uVar1 < 0x11) {
    if (offset >> 4 != (offset + uVar1) - 1 >> 4) {
      return true;
    }
  }
  else if ((offset & 0xf) != 0) {
    return true;
  }
  return false;
}

Assistant:

bool hasImproperStraddle(uint32_t id, uint32_t offset,
                         const LayoutConstraints& inherited,
                         MemberConstraints& constraints,
                         ValidationState_t& vstate) {
  const auto size = getSize(id, inherited, constraints, vstate);
  const auto F = offset;
  const auto L = offset + size - 1;
  if (size <= 16) {
    if ((F >> 4) != (L >> 4)) return true;
  } else {
    if (F % 16 != 0) return true;
  }
  return false;
}